

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.h
# Opt level: O1

void __thiscall
HighsGFkSolve::fromCSC<2u,1,long>
          (HighsGFkSolve *this,vector<long,_std::allocator<long>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart,
          HighsInt numRow)

{
  pointer puVar1;
  pointer piVar2;
  iterator __position;
  iterator iVar3;
  int iVar4;
  int *__args;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  uint uVar5;
  long lVar6;
  size_type sVar7;
  uint uVar8;
  long lVar9;
  value_type_conflict3 local_58;
  uint local_54;
  vector<int,std::allocator<int>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  puVar1 = (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  piVar2 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar2 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_40 = &this->Avalue;
  local_48 = (vector<int,std::allocator<int>> *)&this->Acol;
  local_50 = (vector<int,std::allocator<int>> *)&this->Arow;
  piVar2 = (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = Aindex;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  iVar4 = (int)((ulong)((long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  this->numCol = iVar4;
  this->numRow = numRow;
  local_58 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colhead,(long)iVar4,(value_type_conflict2 *)&local_58);
  lVar6 = 0;
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colsize,(long)this->numCol,(value_type_conflict2 *)&local_58);
  sVar7 = (size_type)numRow;
  local_58 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->rhs,sVar7,&local_58);
  local_58 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowroot,sVar7,(value_type_conflict2 *)&local_58);
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowsize,sVar7,(value_type_conflict2 *)&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_40,(long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_48,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_50,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_58 = 0;
  if (this->numCol != 0) {
    do {
      piVar2 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = piVar2[(int)lVar6];
      lVar6 = (long)(int)local_58;
      if (iVar4 != piVar2[lVar6 + 1]) {
        lVar9 = (long)iVar4 << 2;
        do {
          if ((*(byte *)((long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar9 * 2) & 1) != 0) {
            local_54 = 1;
            __position._M_current =
                 (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_40,__position,&local_54);
            }
            else {
              *__position._M_current = 1;
              (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar3._M_current =
                 (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_48,iVar3,(int *)&local_58);
            }
            else {
              *iVar3._M_current = local_58;
              (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            __args = (int *)((long)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + lVar9);
            iVar3._M_current =
                 (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_50,iVar3,__args);
            }
            else {
              *iVar3._M_current = *__args;
              (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
          lVar6 = (long)(int)local_58;
          lVar9 = lVar9 + 4;
          iVar4 = iVar4 + 1;
        } while (iVar4 != (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar6 + 1]);
      }
      lVar6 = lVar6 + 1;
      local_58 = (value_type_conflict3)lVar6;
    } while (local_58 != this->numCol);
  }
  uVar8 = (uint)((ulong)((long)(this->Avalue).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Avalue).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  sVar7 = (size_type)(int)uVar8;
  std::vector<int,_std::allocator<int>_>::resize(&this->Anext,sVar7);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aprev,sVar7);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARleft,sVar7);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARright,sVar7);
  if (uVar8 != 0) {
    uVar5 = 0;
    __to = extraout_RDX;
    do {
      link(this,(char *)(ulong)uVar5,__to);
      uVar5 = uVar5 + 1;
      __to = extraout_RDX_00;
    } while (uVar8 != uVar5);
  }
  return;
}

Assistant:

void fromCSC(const std::vector<T>& Aval, const std::vector<HighsInt>& Aindex,
               const std::vector<HighsInt>& Astart, HighsInt numRow) {
    Avalue.clear();
    Acol.clear();
    Arow.clear();

    freeslots = decltype(freeslots)();

    numCol = Astart.size() - 1;
    this->numRow = numRow;

    colhead.assign(numCol, -1);
    colsize.assign(numCol, 0);

    rhs.assign(kNumRhs * numRow, 0);
    rowroot.assign(numRow, -1);
    rowsize.assign(numRow, 0);

    Avalue.reserve(Aval.size());
    Acol.reserve(Aval.size());
    Arow.reserve(Aval.size());

    for (HighsInt i = 0; i != numCol; ++i) {
      for (HighsInt j = Astart[i]; j != Astart[i + 1]; ++j) {
        assert(Aval[j] == (int64_t)Aval[j]);
        int64_t val = ((int64_t)Aval[j]) % k;
        if (val == 0) continue;

        if (val < 0) val += k;
        assert(val >= 0);

        Avalue.push_back(val);
        Acol.push_back(i);
        Arow.push_back(Aindex[j]);
      }
    }

    HighsInt nnz = Avalue.size();
    Anext.resize(nnz);
    Aprev.resize(nnz);
    ARleft.resize(nnz);
    ARright.resize(nnz);
    for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);
  }